

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

void __thiscall sf::String::String(String *this,wstring *wideString)

{
  pointer pwVar1;
  pointer pwVar2;
  
  (this->m_string)._M_dataplus._M_p = (pointer)&(this->m_string).field_2;
  (this->m_string)._M_string_length = 0;
  (this->m_string).field_2._M_local_buf[0] = 0;
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::reserve
            (&this->m_string,wideString->_M_string_length + 1);
  if (0 < (long)wideString->_M_string_length) {
    pwVar2 = (wideString->_M_dataplus)._M_p;
    pwVar1 = pwVar2 + wideString->_M_string_length;
    do {
      std::__cxx11::
      basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
      push_back(&this->m_string,*pwVar2);
      pwVar2 = pwVar2 + 1;
    } while (pwVar2 < pwVar1);
  }
  return;
}

Assistant:

String::String(const std::wstring& wideString)
{
    m_string.reserve(wideString.length() + 1);
    Utf32::fromWide(wideString.begin(), wideString.end(), std::back_inserter(m_string));
}